

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<short,int>
          (String *__return_storage_ptr__,detail *this,short *lhs,char *op,int *rhs)

{
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  doctest::toString(&local_48,*(short *)this);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  doctest::toString(&SStack_78,*(int *)op);
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }